

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemFile.cpp
# Opt level: O0

ssize_t __thiscall MemFile::read(MemFile *this,int __fd,void *__buf,size_t __nbytes)

{
  int *piVar1;
  undefined4 in_register_00000034;
  MemFile *this_00;
  allocator<unsigned_char> local_39;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_38;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_30;
  undefined1 local_25;
  int local_24;
  int local_20;
  int local_1c;
  int avail_bytes;
  int len_local;
  MemFile *this_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data;
  
  this_00 = (MemFile *)CONCAT44(in_register_00000034,__fd);
  local_1c = (int)__buf;
  _avail_bytes = this_00;
  this_local = this;
  local_24 = remaining(this_00);
  piVar1 = std::min<int>(&local_1c,&local_24);
  local_20 = *piVar1;
  local_25 = 0;
  local_30._M_current = (this_00->m_it)._M_current;
  local_38 = __gnu_cxx::
             __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator+(&this_00->m_it,(long)local_20);
  std::allocator<unsigned_char>::allocator(&local_39);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,local_30,local_38,&local_39
            );
  std::allocator<unsigned_char>::~allocator(&local_39);
  __gnu_cxx::
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
  operator+=(&this_00->m_it,(long)local_20);
  return (ssize_t)this;
}

Assistant:

std::vector<uint8_t> MemFile::read(int len)
{
    auto avail_bytes = std::min(len, remaining());
    std::vector<uint8_t> data(m_it, m_it + avail_bytes);
    m_it += avail_bytes;
    return data;
}